

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  long lVar6;
  secp256k1_ge *psVar7;
  byte bVar8;
  int overflow;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  bVar8 = 0;
  if (ctx->declassify != 0) {
    secp256k1_keypair_load_cold_1();
  }
  uVar5 = secp256k1_pubkey_load(ctx,pk,(secp256k1_pubkey *)(keypair->data + 0x20));
  if (sk != (secp256k1_scalar *)0x0) {
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      secp256k1_scalar_set_b32(sk,keypair->data,&local_34);
      bVar3 = sk->d[3] != 0;
      bVar4 = sk->d[1] != 0;
      bVar1 = sk->d[2] != 0;
      bVar2 = sk->d[0] != 0;
      if (ctx->declassify != 0) {
        secp256k1_keypair_load_cold_2();
      }
      if ((!bVar3 && !bVar4) && (!bVar1 && !bVar2) || local_34 != 0) {
        secp256k1_keypair_load_cold_3();
      }
      uVar5 = (uint)(((bVar3 || bVar4) || (bVar1 || bVar2)) && local_34 == 0);
    }
  }
  if (uVar5 == 0) {
    psVar7 = &secp256k1_ge_const_g;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pk->x).n[0] = (psVar7->x).n[0];
      psVar7 = (secp256k1_ge *)((long)psVar7 + ((ulong)bVar8 * -2 + 1) * 8);
      pk = (secp256k1_ge *)((long)pk + (ulong)bVar8 * -0x10 + 8);
    }
    if (sk != (secp256k1_scalar *)0x0) {
      sk->d[2] = 0;
      sk->d[3] = 0;
      sk->d[0] = 1;
      sk->d[1] = 0;
    }
  }
  return uVar5;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}